

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

bool __thiscall mpt::layout::reset(layout *this)

{
  uint uVar1;
  item_array<mpt::layout::graph> local_20;
  layout *local_18;
  layout *this_local;
  
  local_18 = this;
  if ((this->_parse != (parser *)0x0) &&
     (uVar1 = (*this->_parse->_vptr_parser[2])(), (uVar1 & 1) == 0)) {
    return false;
  }
  item_array<mpt::layout::graph>::item_array(&local_20,-1);
  item_array<mpt::layout::graph>::operator=(&this->_graphs,&local_20);
  item_array<mpt::layout::graph>::~item_array(&local_20);
  (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x11])
            (this,0,0xffffffff);
  (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x10])
            (this,0,0xffffffff);
  return true;
}

Assistant:

bool layout::reset()
{
	if (_parse && !_parse->reset()) {
		return false;
	}
	_graphs = item_array<graph>();
	set_font(0);
	set_alias(0);
	return true;
}